

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
FBX::Decoder::readArray<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Decoder *this)

{
  undefined1 __src [8];
  uint uVar1;
  int *__dest;
  size_t sVar2;
  Span<int> SVar3;
  undefined1 local_80 [8];
  Span<int> data;
  Span<char> local_60;
  vector<int,_std::allocator<int>_> local_50;
  undefined1 local_31;
  size_t local_30;
  size_t completeLength;
  size_t encoding;
  size_t arraySize;
  Decoder *this_local;
  vector<int,_std::allocator<int>_> *buffer;
  
  arraySize = (size_t)this;
  this_local = (Decoder *)__return_storage_ptr__;
  uVar1 = Stream::read<unsigned_int>(&this->stream);
  encoding = (size_t)uVar1;
  uVar1 = Stream::read<unsigned_int>(&this->stream);
  completeLength = (size_t)uVar1;
  uVar1 = Stream::read<unsigned_int>(&this->stream);
  local_30 = (size_t)uVar1;
  local_31 = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  if (completeLength == 1) {
    local_60 = Stream::read<char>(&this->stream,local_30);
    decompress<int>(&local_50,this,&local_60);
    std::vector<int,_std::allocator<int>_>::operator=(__return_storage_ptr__,&local_50);
    std::vector<int,_std::allocator<int>_>::~vector(&local_50);
  }
  else {
    SVar3 = Stream::read<int>(&this->stream,local_30);
    data.begin = SVar3.end;
    local_80 = (undefined1  [8])SVar3.begin;
    std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,encoding);
    __dest = std::vector<int,_std::allocator<int>_>::data(__return_storage_ptr__);
    __src = local_80;
    sVar2 = Span<int>::size((Span<int> *)local_80);
    memcpy(__dest,(void *)__src,sVar2 << 2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> Decoder::readArray() {
        size_t arraySize = stream.read<std::uint32_t>();
        size_t encoding = stream.read<std::uint32_t>();
        size_t completeLength = stream.read<std::uint32_t>();

        std::vector<T> buffer;
        if (encoding == 1)
            buffer = decompress<T>(stream.read<char>(completeLength));
        else {
            auto data = stream.read<T>(completeLength);
            buffer.resize(arraySize);
            std::memcpy(buffer.data(), data.begin, data.size() * sizeof(T));
        }

        return buffer;
    }